

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinImporter::ReadBinaryLight(AssbinImporter *this,IOStream *stream,aiLight *l)

{
  uint uVar1;
  aiLightSourceType aVar2;
  DeadlyImportError *this_00;
  ulong __n;
  float fVar3;
  allocator<char> local_429;
  undefined1 local_428 [1032];
  
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 == 0x1235) {
    Read<unsigned_int>(stream);
    Read<aiString>((aiString *)local_428,stream);
    if ((aiLight *)local_428 != l) {
      __n = (ulong)(uint)local_428._0_4_;
      (l->mName).length = local_428._0_4_;
      memcpy((l->mName).data,local_428 + 4,__n);
      (l->mName).data[__n] = '\0';
    }
    aVar2 = Read<unsigned_int>(stream);
    l->mType = aVar2;
    if (aVar2 != aiLightSource_DIRECTIONAL) {
      fVar3 = Read<float>(stream);
      l->mAttenuationConstant = fVar3;
      fVar3 = Read<float>(stream);
      l->mAttenuationLinear = fVar3;
      fVar3 = Read<float>(stream);
      l->mAttenuationQuadratic = fVar3;
    }
    Read<aiColor3D>((IOStream *)local_428);
    (l->mColorDiffuse).r = (ai_real)local_428._0_4_;
    (l->mColorDiffuse).g = (ai_real)local_428._4_4_;
    (l->mColorDiffuse).b = (ai_real)local_428._8_4_;
    Read<aiColor3D>((IOStream *)local_428);
    (l->mColorSpecular).r = (ai_real)local_428._0_4_;
    (l->mColorSpecular).g = (ai_real)local_428._4_4_;
    (l->mColorSpecular).b = (ai_real)local_428._8_4_;
    Read<aiColor3D>((IOStream *)local_428);
    (l->mColorAmbient).r = (ai_real)local_428._0_4_;
    (l->mColorAmbient).g = (ai_real)local_428._4_4_;
    (l->mColorAmbient).b = (ai_real)local_428._8_4_;
    if (l->mType == aiLightSource_SPOT) {
      fVar3 = Read<float>(stream);
      l->mAngleInnerCone = fVar3;
      fVar3 = Read<float>(stream);
      l->mAngleOuterCone = fVar3;
    }
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_428,"Magic chunk identifiers are wrong!",&local_429);
  DeadlyImportError::DeadlyImportError(this_00,(string *)local_428);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssbinImporter::ReadBinaryLight( IOStream * stream, aiLight* l ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AILIGHT)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    l->mName = Read<aiString>(stream);
    l->mType = (aiLightSourceType)Read<unsigned int>(stream);

    if (l->mType != aiLightSource_DIRECTIONAL) {
        l->mAttenuationConstant = Read<float>(stream);
        l->mAttenuationLinear = Read<float>(stream);
        l->mAttenuationQuadratic = Read<float>(stream);
    }

    l->mColorDiffuse = Read<aiColor3D>(stream);
    l->mColorSpecular = Read<aiColor3D>(stream);
    l->mColorAmbient = Read<aiColor3D>(stream);

    if (l->mType == aiLightSource_SPOT) {
        l->mAngleInnerCone = Read<float>(stream);
        l->mAngleOuterCone = Read<float>(stream);
    }
}